

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void tcg_x86_init_x86_64(uc_struct_conflict *uc)

{
  TCGContext *s;
  TCGTemp *pTVar1;
  long lVar2;
  char (*name) [4];
  long lVar3;
  
  s = uc->tcg_ctx;
  lVar2 = 0;
  pTVar1 = tcg_global_mem_new_internal_x86_64(s,TCG_TYPE_I32,s->cpu_env,0xa8,"cc_op");
  s->cpu_cc_op = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_x86_64(s,TCG_TYPE_I64,s->cpu_env,0x90,"cc_dst");
  s->cpu_cc_dst = (TCGv_i64)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_x86_64(s,TCG_TYPE_I64,s->cpu_env,0x98,"cc_src");
  s->cpu_cc_src = (TCGv_i64)((long)pTVar1 - (long)s);
  pTVar1 = tcg_global_mem_new_internal_x86_64(s,TCG_TYPE_I64,s->cpu_env,0xa0,"cc_src2");
  s->cpu_cc_src2 = (TCGv_i64)((long)pTVar1 - (long)s);
  name = tcg_x86_init_x86_64::reg_names;
  do {
    pTVar1 = tcg_global_mem_new_internal_x86_64(s,TCG_TYPE_I64,s->cpu_env,lVar2,*name);
    *(long *)((long)s->cpu_regs + lVar2) = (long)pTVar1 - (long)s;
    lVar2 = lVar2 + 8;
    name = name + 1;
  } while (lVar2 != 0x80);
  lVar2 = 0xc0;
  lVar3 = 0;
  do {
    pTVar1 = tcg_global_mem_new_internal_x86_64
                       (s,TCG_TYPE_I64,s->cpu_env,lVar2,
                        tcg_x86_init_x86_64::seg_base_names[0] + lVar3);
    *(long *)((long)s->cpu_seg_base + lVar3) = (long)pTVar1 - (long)s;
    lVar3 = lVar3 + 8;
    lVar2 = lVar2 + 0x18;
  } while (lVar3 != 0x30);
  lVar2 = 0x1e0;
  lVar3 = 0;
  do {
    pTVar1 = tcg_global_mem_new_internal_x86_64
                       (s,TCG_TYPE_I64,s->cpu_env,lVar2 + -8,
                        tcg_x86_init_x86_64::bnd_regl_names[0] + lVar3);
    *(long *)((long)s->cpu_bndl + lVar3) = (long)pTVar1 - (long)s;
    pTVar1 = tcg_global_mem_new_internal_x86_64
                       (s,TCG_TYPE_I64,s->cpu_env,lVar2,
                        tcg_x86_init_x86_64::bnd_regu_names[0] + lVar3);
    *(long *)((long)s->cpu_bndu + lVar3) = (long)pTVar1 - (long)s;
    lVar3 = lVar3 + 8;
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 0x20);
  return;
}

Assistant:

void tcg_x86_init(struct uc_struct *uc)
{
    static const char reg_names[CPU_NB_REGS][4] = {
#ifdef TARGET_X86_64
        [R_EAX] = "rax",
        [R_EBX] = "rbx",
        [R_ECX] = "rcx",
        [R_EDX] = "rdx",
        [R_ESI] = "rsi",
        [R_EDI] = "rdi",
        [R_EBP] = "rbp",
        [R_ESP] = "rsp",
        [8]  = "r8",
        [9]  = "r9",
        [10] = "r10",
        [11] = "r11",
        [12] = "r12",
        [13] = "r13",
        [14] = "r14",
        [15] = "r15",
#else
        [R_EAX] = "eax",
        [R_EBX] = "ebx",
        [R_ECX] = "ecx",
        [R_EDX] = "edx",
        [R_ESI] = "esi",
        [R_EDI] = "edi",
        [R_EBP] = "ebp",
        [R_ESP] = "esp",
#endif
    };
    static const char seg_base_names[6][8] = {
        [R_CS] = "cs_base",
        [R_DS] = "ds_base",
        [R_ES] = "es_base",
        [R_FS] = "fs_base",
        [R_GS] = "gs_base",
        [R_SS] = "ss_base",
    };
    static const char bnd_regl_names[4][8] = {
        "bnd0_lb", "bnd1_lb", "bnd2_lb", "bnd3_lb"
    };
    static const char bnd_regu_names[4][8] = {
        "bnd0_ub", "bnd1_ub", "bnd2_ub", "bnd3_ub"
    };
    int i;
    TCGContext *tcg_ctx = uc->tcg_ctx;

    tcg_ctx->cpu_cc_op = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env,
                                       offsetof(CPUX86State, cc_op), "cc_op");
    tcg_ctx->cpu_cc_dst = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUX86State, cc_dst),
                                    "cc_dst");
    tcg_ctx->cpu_cc_src = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUX86State, cc_src),
                                    "cc_src");
    tcg_ctx->cpu_cc_src2 = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUX86State, cc_src2),
                                     "cc_src2");

    for (i = 0; i < CPU_NB_REGS; ++i) {
        tcg_ctx->cpu_regs[i] = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env,
                                         offsetof(CPUX86State, regs[i]),
                                         reg_names[i]);
    }

    for (i = 0; i < 6; ++i) {
        tcg_ctx->cpu_seg_base[i]
            = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env,
                                 offsetof(CPUX86State, segs[i].base),
                                 seg_base_names[i]);
    }

    for (i = 0; i < 4; ++i) {
        tcg_ctx->cpu_bndl[i]
            = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
                                     offsetof(CPUX86State, bnd_regs[i].lb),
                                     bnd_regl_names[i]);
        tcg_ctx->cpu_bndu[i]
            = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
                                     offsetof(CPUX86State, bnd_regs[i].ub),
                                     bnd_regu_names[i]);
    }
}